

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprAttachSubtrees(sqlite3 *db,Expr *pRoot,Expr *pLeft,Expr *pRight)

{
  if (pRoot != (Expr *)0x0) {
    if (pRight != (Expr *)0x0) {
      pRoot->pRight = pRight;
      pRoot->flags = pRoot->flags | pRight->flags & 0x400208;
    }
    if (pLeft != (Expr *)0x0) {
      pRoot->pLeft = pLeft;
      pRoot->flags = pRoot->flags | pLeft->flags & 0x400208;
    }
    exprSetHeight(pRoot);
    return;
  }
  if (pLeft != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pLeft);
  }
  if (pRight != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pRight);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAttachSubtrees(
  sqlite3 *db,
  Expr *pRoot,
  Expr *pLeft,
  Expr *pRight
){
  if( pRoot==0 ){
    assert( db->mallocFailed );
    sqlite3ExprDelete(db, pLeft);
    sqlite3ExprDelete(db, pRight);
  }else{
    if( pRight ){
      pRoot->pRight = pRight;
      pRoot->flags |= EP_Propagate & pRight->flags;
    }
    if( pLeft ){
      pRoot->pLeft = pLeft;
      pRoot->flags |= EP_Propagate & pLeft->flags;
    }
    exprSetHeight(pRoot);
  }
}